

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

value signature_metadata_args_map(signature s)

{
  value *ppvVar1;
  value pvVar2;
  long in_RDI;
  value *args_map_ptr;
  signature_node node;
  size_t index;
  value *args_array;
  value args;
  value in_stack_00000040;
  value *in_stack_ffffffffffffffc8;
  signature_node in_stack_ffffffffffffffd0;
  type_conflict t;
  char *local_8;
  
  local_8 = (char *)value_create_array((value *)in_stack_ffffffffffffffd0,
                                       (size_t)in_stack_ffffffffffffffc8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) != 0) {
    ppvVar1 = value_to_array((value)0x106d50);
    for (t = (type_conflict)0x0; t < *(type_conflict *)(in_RDI + 0x10);
        t = (type_conflict)((long)&t->id + 1)) {
      in_stack_ffffffffffffffd0 = signature_at((signature)t,(size_t)in_stack_ffffffffffffffd0);
      pvVar2 = value_create_map((value *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8
                               );
      ppvVar1[(long)t] = pvVar2;
      if (ppvVar1[(long)t] == (value)0x0) {
        value_type_destroy(in_stack_00000040);
        return (value)0x0;
      }
      in_stack_ffffffffffffffc8 = value_to_map((value)0x106de1);
      pvVar2 = signature_metadata_args_map_name(local_8);
      *in_stack_ffffffffffffffc8 = pvVar2;
      if (*in_stack_ffffffffffffffc8 == (value)0x0) {
        value_type_destroy(in_stack_00000040);
        return (value)0x0;
      }
      pvVar2 = type_metadata(t);
      in_stack_ffffffffffffffc8[1] = pvVar2;
      if (in_stack_ffffffffffffffc8[1] == (value)0x0) {
        value_type_destroy(in_stack_00000040);
        return (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value signature_metadata_args_map(signature s)
{
	value args = value_create_array(NULL, s->count);

	if (args == NULL)
	{
		return NULL;
	}

	if (s->count > 0)
	{
		value *args_array = value_to_array(args);

		size_t index;

		for (index = 0; index < s->count; ++index)
		{
			signature_node node = signature_at(s, index);

			value *args_map_ptr;

			args_array[index] = value_create_map(NULL, 2);

			if (args_array[index] == NULL)
			{
				value_type_destroy(args);

				return NULL;
			}

			args_map_ptr = value_to_map(args_array[index]);

			args_map_ptr[0] = signature_metadata_args_map_name(node->name);

			if (args_map_ptr[0] == NULL)
			{
				value_type_destroy(args);

				return NULL;
			}

			args_map_ptr[1] = type_metadata(node->t);

			if (args_map_ptr[1] == NULL)
			{
				value_type_destroy(args);

				return NULL;
			}
		}
	}

	return args;
}